

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::AddSources
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs)

{
  bool bVar1;
  reference pbVar2;
  ulong uVar3;
  cmTargetInternals *pcVar4;
  undefined1 local_d0 [8];
  cmListFileBacktrace lfbt;
  string local_a8;
  char *local_88;
  char *src;
  undefined1 local_70 [8];
  string filename;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  const_iterator i;
  char *sep;
  string srcFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *srcs_local;
  cmTarget *this_local;
  
  srcFiles.field_2._8_8_ = srcs;
  std::__cxx11::string::string((string *)&sep);
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa6057c;
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)srcFiles.field_2._8_8_);
  while( true ) {
    filename.field_2._8_8_ =
         (size_type)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(srcFiles.field_2._8_8_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&filename.field_2 + 8));
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_48);
    std::__cxx11::string::string((string *)local_70,(string *)pbVar2);
    local_88 = (char *)std::__cxx11::string::c_str();
    if ((*local_88 == '$') && (local_88[1] == '<')) {
LAB_0058f3ea:
      std::__cxx11::string::operator+=((string *)&sep,(char *)i._M_current);
      std::__cxx11::string::operator+=((string *)&sep,(string *)local_70);
      i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa32383;
      lfbt.Cur._4_4_ = 0;
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
LAB_0058f3cd:
        cmMakefile::GetOrCreateSource(this->Makefile,(string *)local_70,false);
        goto LAB_0058f3ea;
      }
      ProcessSourceItemCMP0049(&local_a8,this,(string *)local_70);
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) goto LAB_0058f3cd;
      lfbt.Cur._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_70);
    if (lfbt.Cur._4_4_ != 0) goto LAB_0058f512;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_48);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmMakefile::GetBacktrace((cmListFileBacktrace *)local_d0,this->Makefile);
    pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pcVar4->SourceEntries,(value_type *)&sep);
    pcVar4 = cmTargetInternalPointer::operator->(&this->Internal);
    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
              (&pcVar4->SourceBacktraces,(value_type *)local_d0);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_d0);
  }
  lfbt.Cur._4_4_ = 0;
LAB_0058f512:
  std::__cxx11::string::~string((string *)&sep);
  return;
}

Assistant:

void cmTarget::AddSources(std::vector<std::string> const& srcs)
{
  std::string srcFiles;
  const char* sep = "";
  for (std::vector<std::string>::const_iterator i = srcs.begin();
       i != srcs.end(); ++i) {
    std::string filename = *i;
    const char* src = filename.c_str();

    if (!(src[0] == '$' && src[1] == '<')) {
      if (!filename.empty()) {
        filename = this->ProcessSourceItemCMP0049(filename);
        if (filename.empty()) {
          return;
        }
      }
      this->Makefile->GetOrCreateSource(filename);
    }
    srcFiles += sep;
    srcFiles += filename;
    sep = ";";
  }
  if (!srcFiles.empty()) {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.push_back(srcFiles);
    this->Internal->SourceBacktraces.push_back(lfbt);
  }
}